

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  Scene *pSVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar33;
  undefined1 auVar27 [16];
  float fVar34;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar46;
  float fVar47;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar57;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  float fVar72;
  float fVar73;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar74 [16];
  float fVar82;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar83;
  undefined1 auVar77 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [16];
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  undefined1 auVar106 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [64];
  float fVar129;
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar137 [16];
  float fVar143;
  undefined1 auVar138 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_acd;
  int local_acc;
  undefined8 local_ac8;
  float fStack_ac0;
  float fStack_abc;
  undefined8 local_ab8;
  float fStack_ab0;
  float fStack_aac;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  RayQueryContext *local_a90;
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  ulong *local_a30;
  long local_a28;
  long local_a20;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  uint local_a00;
  uint local_9fc;
  uint local_9f8;
  RTCFilterFunctionNArguments local_9e8;
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      puVar22 = local_7d8 + 1;
      auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar4 = (ray->dir).field_0;
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx((undefined1  [16])aVar4,auVar69);
      auVar84._8_4_ = 0x219392ef;
      auVar84._0_8_ = 0x219392ef219392ef;
      auVar84._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar69,auVar84,1);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = 0x3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar84 = vdivps_avx(auVar85,(undefined1  [16])aVar4);
      auVar86._8_4_ = 0x5d5e0b6b;
      auVar86._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar86._12_4_ = 0x5d5e0b6b;
      auVar69 = vblendvps_avx(auVar84,auVar86,auVar69);
      auVar74._0_4_ = auVar69._0_4_ * 0.99999964;
      auVar74._4_4_ = auVar69._4_4_ * 0.99999964;
      auVar74._8_4_ = auVar69._8_4_ * 0.99999964;
      auVar74._12_4_ = auVar69._12_4_ * 0.99999964;
      auVar60._0_4_ = auVar69._0_4_ * 1.0000004;
      auVar60._4_4_ = auVar69._4_4_ * 1.0000004;
      auVar60._8_4_ = auVar69._8_4_ * 1.0000004;
      auVar60._12_4_ = auVar69._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_908._4_4_ = uVar3;
      local_908._0_4_ = uVar3;
      local_908._8_4_ = uVar3;
      local_908._12_4_ = uVar3;
      auVar100 = ZEXT1664(local_908);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_918._4_4_ = uVar3;
      local_918._0_4_ = uVar3;
      local_918._8_4_ = uVar3;
      local_918._12_4_ = uVar3;
      auVar106 = ZEXT1664(local_918);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_928._4_4_ = uVar3;
      local_928._0_4_ = uVar3;
      local_928._8_4_ = uVar3;
      local_928._12_4_ = uVar3;
      auVar113 = ZEXT1664(local_928);
      local_938 = vshufps_avx(auVar74,auVar74,0);
      auVar115 = ZEXT1664(local_938);
      auVar69 = vmovshdup_avx(auVar74);
      local_948 = vshufps_avx(auVar74,auVar74,0x55);
      auVar120 = ZEXT1664(local_948);
      auVar84 = vshufpd_avx(auVar74,auVar74,1);
      local_958 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar77 = ZEXT1664(local_958);
      local_968 = vshufps_avx(auVar60,auVar60,0);
      auVar125 = ZEXT1664(local_968);
      uVar23 = (ulong)(auVar74._0_4_ < 0.0) << 4;
      local_978 = vshufps_avx(auVar60,auVar60,0x55);
      auVar90 = ZEXT1664(local_978);
      local_988 = vshufps_avx(auVar60,auVar60,0xaa);
      auVar70 = ZEXT1664(local_988);
      uVar24 = (ulong)(auVar69._0_4_ < 0.0) << 4 | 0x20;
      uVar21 = (ulong)(auVar84._0_4_ < 0.0) << 4 | 0x40;
      uVar25 = uVar23 ^ 0x10;
      local_998 = vshufps_avx(auVar27,auVar27,0);
      auVar94 = ZEXT1664(local_998);
      local_9a8 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      auVar131 = ZEXT1664(local_9a8);
      local_9b8 = mm_lookupmask_ps._240_16_;
      local_a90 = context;
LAB_00b695e4:
      if (puVar22 != local_7d8) {
        uVar26 = puVar22[-1];
        puVar22 = puVar22 + -1;
        while ((uVar26 & 8) == 0) {
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar23),auVar100._0_16_);
          auVar27._0_4_ = auVar115._0_4_ * auVar69._0_4_;
          auVar27._4_4_ = auVar115._4_4_ * auVar69._4_4_;
          auVar27._8_4_ = auVar115._8_4_ * auVar69._8_4_;
          auVar27._12_4_ = auVar115._12_4_ * auVar69._12_4_;
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar24),auVar106._0_16_);
          auVar36._0_4_ = auVar120._0_4_ * auVar69._0_4_;
          auVar36._4_4_ = auVar120._4_4_ * auVar69._4_4_;
          auVar36._8_4_ = auVar120._8_4_ * auVar69._8_4_;
          auVar36._12_4_ = auVar120._12_4_ * auVar69._12_4_;
          auVar69 = vmaxps_avx(auVar27,auVar36);
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar21),auVar113._0_16_);
          auVar37._0_4_ = auVar77._0_4_ * auVar84._0_4_;
          auVar37._4_4_ = auVar77._4_4_ * auVar84._4_4_;
          auVar37._8_4_ = auVar77._8_4_ * auVar84._8_4_;
          auVar37._12_4_ = auVar77._12_4_ * auVar84._12_4_;
          auVar84 = vmaxps_avx(auVar37,auVar94._0_16_);
          auVar69 = vmaxps_avx(auVar69,auVar84);
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar25),auVar100._0_16_);
          auVar38._0_4_ = auVar125._0_4_ * auVar84._0_4_;
          auVar38._4_4_ = auVar125._4_4_ * auVar84._4_4_;
          auVar38._8_4_ = auVar125._8_4_ * auVar84._8_4_;
          auVar38._12_4_ = auVar125._12_4_ * auVar84._12_4_;
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar24 ^ 0x10)),
                               auVar106._0_16_);
          auVar50._0_4_ = auVar90._0_4_ * auVar84._0_4_;
          auVar50._4_4_ = auVar90._4_4_ * auVar84._4_4_;
          auVar50._8_4_ = auVar90._8_4_ * auVar84._8_4_;
          auVar50._12_4_ = auVar90._12_4_ * auVar84._12_4_;
          auVar84 = vminps_avx(auVar38,auVar50);
          auVar27 = vsubps_avx(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar21 ^ 0x10)),
                               auVar113._0_16_);
          auVar51._0_4_ = auVar70._0_4_ * auVar27._0_4_;
          auVar51._4_4_ = auVar70._4_4_ * auVar27._4_4_;
          auVar51._8_4_ = auVar70._8_4_ * auVar27._8_4_;
          auVar51._12_4_ = auVar70._12_4_ * auVar27._12_4_;
          auVar27 = vminps_avx(auVar51,auVar131._0_16_);
          auVar84 = vminps_avx(auVar84,auVar27);
          auVar69 = vcmpps_avx(auVar69,auVar84,2);
          uVar16 = vmovmskps_avx(auVar69);
          if (uVar16 == 0) goto LAB_00b695e4;
          uVar16 = uVar16 & 0xff;
          uVar17 = uVar26 & 0xfffffffffffffff0;
          lVar18 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar26 = *(ulong *)(uVar17 + lVar18 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          uVar19 = (ulong)uVar16;
          if (uVar16 != 0) {
            do {
              *puVar22 = uVar26;
              puVar22 = puVar22 + 1;
              lVar18 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                }
              }
              uVar26 = *(ulong *)(uVar17 + lVar18 * 8);
              uVar19 = uVar19 - 1 & uVar19;
            } while (uVar19 != 0);
          }
        }
        local_a20 = (ulong)((uint)uVar26 & 0xf) - 8;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        for (local_a28 = 0; local_a28 != local_a20; local_a28 = local_a28 + 1) {
          lVar18 = local_a28 * 0x50;
          pSVar20 = context->scene;
          ppfVar5 = (pSVar20->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar26 + 0x30 + lVar18)];
          pfVar7 = ppfVar5[*(uint *)(uVar26 + 0x34 + lVar18)];
          pfVar8 = ppfVar5[*(uint *)(uVar26 + 0x38 + lVar18)];
          pfVar9 = ppfVar5[*(uint *)(uVar26 + 0x3c + lVar18)];
          auVar27 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 8 + lVar18)));
          auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 8 + lVar18)));
          auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 4 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 0xc + lVar18)))
          ;
          auVar84 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 4 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 0xc + lVar18)))
          ;
          auVar85 = vunpcklps_avx(auVar69,auVar84);
          auVar86 = vunpcklps_avx(auVar27,auVar60);
          auVar69 = vunpckhps_avx(auVar27,auVar60);
          auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x10 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar26 + 0x18 + lVar18)));
          auVar84 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x10 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar26 + 0x18 + lVar18)));
          auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x14 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x1c + lVar18)));
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x14 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x1c + lVar18)));
          auVar36 = vunpcklps_avx(auVar84,auVar27);
          auVar37 = vunpcklps_avx(auVar60,auVar74);
          auVar84 = vunpckhps_avx(auVar60,auVar74);
          auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x20 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar26 + 0x28 + lVar18)));
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x20 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar26 + 0x28 + lVar18)));
          auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x24 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x2c + lVar18)));
          auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x24 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x2c + lVar18)));
          auVar50 = vunpcklps_avx(auVar27,auVar60);
          auVar60 = vunpcklps_avx(auVar74,auVar38);
          auVar74 = vunpckhps_avx(auVar74,auVar38);
          puVar1 = (undefined8 *)(uVar26 + 0x30 + lVar18);
          local_898 = *puVar1;
          uStack_890 = puVar1[1];
          puVar1 = (undefined8 *)(uVar26 + 0x40 + lVar18);
          local_8a8 = *puVar1;
          uStack_8a0 = puVar1[1];
          uVar3 = *(undefined4 *)&(ray->org).field_0;
          auVar110._4_4_ = uVar3;
          auVar110._0_4_ = uVar3;
          auVar110._8_4_ = uVar3;
          auVar110._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar130._4_4_ = uVar3;
          auVar130._0_4_ = uVar3;
          auVar130._8_4_ = uVar3;
          auVar130._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar137._4_4_ = uVar3;
          auVar137._0_4_ = uVar3;
          auVar137._8_4_ = uVar3;
          auVar137._12_4_ = uVar3;
          local_a48 = vsubps_avx(auVar86,auVar110);
          local_a58 = vsubps_avx(auVar69,auVar130);
          local_a68 = vsubps_avx(auVar85,auVar137);
          auVar69 = vsubps_avx(auVar37,auVar110);
          auVar84 = vsubps_avx(auVar84,auVar130);
          auVar27 = vsubps_avx(auVar36,auVar137);
          auVar60 = vsubps_avx(auVar60,auVar110);
          auVar74 = vsubps_avx(auVar74,auVar130);
          auVar85 = vsubps_avx(auVar50,auVar137);
          local_a78 = vsubps_avx(auVar60,local_a48);
          local_a88 = vsubps_avx(auVar74,local_a58);
          local_8b8 = vsubps_avx(auVar85,local_a68);
          fVar2 = local_a58._0_4_;
          fVar35 = auVar74._0_4_ + fVar2;
          fVar12 = local_a58._4_4_;
          fVar46 = auVar74._4_4_ + fVar12;
          fVar58 = local_a58._8_4_;
          fVar47 = auVar74._8_4_ + fVar58;
          fVar14 = local_a58._12_4_;
          fVar48 = auVar74._12_4_ + fVar14;
          fVar114 = local_a68._0_4_;
          fVar72 = fVar114 + auVar85._0_4_;
          fVar116 = local_a68._4_4_;
          fVar78 = fVar116 + auVar85._4_4_;
          fVar117 = local_a68._8_4_;
          fVar80 = fVar117 + auVar85._8_4_;
          fVar118 = local_a68._12_4_;
          fVar82 = fVar118 + auVar85._12_4_;
          fVar49 = local_8b8._0_4_;
          auVar102._0_4_ = fVar49 * fVar35;
          fVar57 = local_8b8._4_4_;
          auVar102._4_4_ = fVar57 * fVar46;
          fVar33 = local_8b8._8_4_;
          auVar102._8_4_ = fVar33 * fVar47;
          fVar34 = local_8b8._12_4_;
          auVar102._12_4_ = fVar34 * fVar48;
          fVar145 = local_a88._0_4_;
          auVar111._0_4_ = fVar145 * fVar72;
          fVar146 = local_a88._4_4_;
          auVar111._4_4_ = fVar146 * fVar78;
          fVar147 = local_a88._8_4_;
          auVar111._8_4_ = fVar147 * fVar80;
          fVar148 = local_a88._12_4_;
          auVar111._12_4_ = fVar148 * fVar82;
          auVar86 = vsubps_avx(auVar111,auVar102);
          fVar11 = local_a48._0_4_;
          fVar101 = auVar60._0_4_ + fVar11;
          fVar13 = local_a48._4_4_;
          fVar107 = auVar60._4_4_ + fVar13;
          fVar59 = local_a48._8_4_;
          fVar108 = auVar60._8_4_ + fVar59;
          fVar15 = local_a48._12_4_;
          fVar109 = auVar60._12_4_ + fVar15;
          fVar135 = local_a78._0_4_;
          auVar75._0_4_ = fVar135 * fVar72;
          fVar139 = local_a78._4_4_;
          auVar75._4_4_ = fVar139 * fVar78;
          fVar141 = local_a78._8_4_;
          auVar75._8_4_ = fVar141 * fVar80;
          fVar143 = local_a78._12_4_;
          auVar75._12_4_ = fVar143 * fVar82;
          auVar112._0_4_ = fVar101 * fVar49;
          auVar112._4_4_ = fVar107 * fVar57;
          auVar112._8_4_ = fVar108 * fVar33;
          auVar112._12_4_ = fVar109 * fVar34;
          auVar36 = vsubps_avx(auVar112,auVar75);
          auVar103._0_4_ = fVar145 * fVar101;
          auVar103._4_4_ = fVar146 * fVar107;
          auVar103._8_4_ = fVar147 * fVar108;
          auVar103._12_4_ = fVar148 * fVar109;
          auVar28._0_4_ = fVar135 * fVar35;
          auVar28._4_4_ = fVar139 * fVar46;
          auVar28._8_4_ = fVar141 * fVar47;
          auVar28._12_4_ = fVar143 * fVar48;
          auVar37 = vsubps_avx(auVar28,auVar103);
          local_ab8._4_4_ = (ray->dir).field_0.m128[2];
          local_ac8._4_4_ = (ray->dir).field_0.m128[1];
          fStack_aa0 = (ray->dir).field_0.m128[0];
          local_aa8 = (RTCIntersectArguments *)CONCAT44(fStack_aa0,fStack_aa0);
          fStack_a9c = fStack_aa0;
          local_8d8._0_4_ =
               auVar86._0_4_ * fStack_aa0 +
               local_ac8._4_4_ * auVar36._0_4_ + local_ab8._4_4_ * auVar37._0_4_;
          local_8d8._4_4_ =
               auVar86._4_4_ * fStack_aa0 +
               local_ac8._4_4_ * auVar36._4_4_ + local_ab8._4_4_ * auVar37._4_4_;
          local_8d8._8_4_ =
               auVar86._8_4_ * fStack_aa0 +
               local_ac8._4_4_ * auVar36._8_4_ + local_ab8._4_4_ * auVar37._8_4_;
          local_8d8._12_4_ =
               auVar86._12_4_ * fStack_aa0 +
               local_ac8._4_4_ * auVar36._12_4_ + local_ab8._4_4_ * auVar37._12_4_;
          local_8c8 = vsubps_avx(local_a58,auVar84);
          auVar86 = vsubps_avx(local_a68,auVar27);
          fVar35 = fVar2 + auVar84._0_4_;
          fVar46 = fVar12 + auVar84._4_4_;
          fVar47 = fVar58 + auVar84._8_4_;
          fVar48 = fVar14 + auVar84._12_4_;
          fVar72 = fVar114 + auVar27._0_4_;
          fVar78 = fVar116 + auVar27._4_4_;
          fVar80 = fVar117 + auVar27._8_4_;
          fVar82 = fVar118 + auVar27._12_4_;
          fVar119 = auVar86._0_4_;
          auVar138._0_4_ = fVar119 * fVar35;
          fVar121 = auVar86._4_4_;
          auVar138._4_4_ = fVar121 * fVar46;
          fVar122 = auVar86._8_4_;
          auVar138._8_4_ = fVar122 * fVar47;
          fVar123 = auVar86._12_4_;
          auVar138._12_4_ = fVar123 * fVar48;
          fVar129 = local_8c8._0_4_;
          auVar61._0_4_ = fVar129 * fVar72;
          fVar132 = local_8c8._4_4_;
          auVar61._4_4_ = fVar132 * fVar78;
          fVar133 = local_8c8._8_4_;
          auVar61._8_4_ = fVar133 * fVar80;
          fVar134 = local_8c8._12_4_;
          auVar61._12_4_ = fVar134 * fVar82;
          auVar86 = vsubps_avx(auVar61,auVar138);
          auVar36 = vsubps_avx(local_a48,auVar69);
          fVar136 = auVar36._0_4_;
          auVar76._0_4_ = fVar136 * fVar72;
          fVar140 = auVar36._4_4_;
          auVar76._4_4_ = fVar140 * fVar78;
          fVar142 = auVar36._8_4_;
          auVar76._8_4_ = fVar142 * fVar80;
          fVar144 = auVar36._12_4_;
          auVar76._12_4_ = fVar144 * fVar82;
          fVar72 = fVar11 + auVar69._0_4_;
          fVar78 = fVar13 + auVar69._4_4_;
          fVar80 = fVar59 + auVar69._8_4_;
          fVar82 = fVar15 + auVar69._12_4_;
          auVar104._0_4_ = fVar119 * fVar72;
          auVar104._4_4_ = fVar121 * fVar78;
          auVar104._8_4_ = fVar122 * fVar80;
          auVar104._12_4_ = fVar123 * fVar82;
          auVar36 = vsubps_avx(auVar104,auVar76);
          auVar95._0_4_ = fVar129 * fVar72;
          auVar95._4_4_ = fVar132 * fVar78;
          auVar95._8_4_ = fVar133 * fVar80;
          auVar95._12_4_ = fVar134 * fVar82;
          auVar29._0_4_ = fVar136 * fVar35;
          auVar29._4_4_ = fVar140 * fVar46;
          auVar29._8_4_ = fVar142 * fVar47;
          auVar29._12_4_ = fVar144 * fVar48;
          auVar37 = vsubps_avx(auVar29,auVar95);
          local_878._0_4_ =
               fStack_aa0 * auVar86._0_4_ +
               local_ac8._4_4_ * auVar36._0_4_ + local_ab8._4_4_ * auVar37._0_4_;
          local_878._4_4_ =
               fStack_aa0 * auVar86._4_4_ +
               local_ac8._4_4_ * auVar36._4_4_ + local_ab8._4_4_ * auVar37._4_4_;
          local_878._8_4_ =
               fStack_aa0 * auVar86._8_4_ +
               local_ac8._4_4_ * auVar36._8_4_ + local_ab8._4_4_ * auVar37._8_4_;
          local_878._12_4_ =
               fStack_aa0 * auVar86._12_4_ +
               local_ac8._4_4_ * auVar36._12_4_ + local_ab8._4_4_ * auVar37._12_4_;
          auVar86 = vsubps_avx(auVar69,auVar60);
          fVar107 = auVar60._0_4_ + auVar69._0_4_;
          fVar108 = auVar60._4_4_ + auVar69._4_4_;
          fVar109 = auVar60._8_4_ + auVar69._8_4_;
          fVar71 = auVar60._12_4_ + auVar69._12_4_;
          auVar69 = vsubps_avx(auVar84,auVar74);
          fVar78 = auVar84._0_4_ + auVar74._0_4_;
          fVar80 = auVar84._4_4_ + auVar74._4_4_;
          fVar82 = auVar84._8_4_ + auVar74._8_4_;
          fVar101 = auVar84._12_4_ + auVar74._12_4_;
          auVar84 = vsubps_avx(auVar27,auVar85);
          fVar46 = auVar27._0_4_ + auVar85._0_4_;
          fVar47 = auVar27._4_4_ + auVar85._4_4_;
          fVar48 = auVar27._8_4_ + auVar85._8_4_;
          fVar72 = auVar27._12_4_ + auVar85._12_4_;
          fVar73 = auVar84._0_4_;
          auVar87._0_4_ = fVar73 * fVar78;
          fVar79 = auVar84._4_4_;
          auVar87._4_4_ = fVar79 * fVar80;
          fVar81 = auVar84._8_4_;
          auVar87._8_4_ = fVar81 * fVar82;
          fVar83 = auVar84._12_4_;
          auVar87._12_4_ = fVar83 * fVar101;
          fVar124 = auVar69._0_4_;
          auVar96._0_4_ = fVar124 * fVar46;
          fVar126 = auVar69._4_4_;
          auVar96._4_4_ = fVar126 * fVar47;
          fVar127 = auVar69._8_4_;
          auVar96._8_4_ = fVar127 * fVar48;
          fVar128 = auVar69._12_4_;
          auVar96._12_4_ = fVar128 * fVar72;
          auVar69 = vsubps_avx(auVar96,auVar87);
          fVar35 = auVar86._0_4_;
          auVar39._0_4_ = fVar35 * fVar46;
          fVar46 = auVar86._4_4_;
          auVar39._4_4_ = fVar46 * fVar47;
          fVar47 = auVar86._8_4_;
          auVar39._8_4_ = fVar47 * fVar48;
          fVar48 = auVar86._12_4_;
          auVar39._12_4_ = fVar48 * fVar72;
          auVar97._0_4_ = fVar73 * fVar107;
          auVar97._4_4_ = fVar79 * fVar108;
          auVar97._8_4_ = fVar81 * fVar109;
          auVar97._12_4_ = fVar83 * fVar71;
          auVar84 = vsubps_avx(auVar97,auVar39);
          auVar62._0_4_ = fVar124 * fVar107;
          auVar62._4_4_ = fVar126 * fVar108;
          auVar62._8_4_ = fVar127 * fVar109;
          auVar62._12_4_ = fVar128 * fVar71;
          auVar52._0_4_ = fVar35 * fVar78;
          auVar52._4_4_ = fVar46 * fVar80;
          auVar52._8_4_ = fVar47 * fVar82;
          auVar52._12_4_ = fVar48 * fVar101;
          auVar27 = vsubps_avx(auVar52,auVar62);
          local_ab8._0_4_ = local_ab8._4_4_;
          fStack_ab0 = local_ab8._4_4_;
          fStack_aac = local_ab8._4_4_;
          local_ac8._0_4_ = local_ac8._4_4_;
          fStack_ac0 = local_ac8._4_4_;
          fStack_abc = local_ac8._4_4_;
          auVar40._0_4_ =
               fStack_aa0 * auVar69._0_4_ +
               local_ac8._4_4_ * auVar84._0_4_ + local_ab8._4_4_ * auVar27._0_4_;
          auVar40._4_4_ =
               fStack_aa0 * auVar69._4_4_ +
               local_ac8._4_4_ * auVar84._4_4_ + local_ab8._4_4_ * auVar27._4_4_;
          auVar40._8_4_ =
               fStack_aa0 * auVar69._8_4_ +
               local_ac8._4_4_ * auVar84._8_4_ + local_ab8._4_4_ * auVar27._8_4_;
          auVar40._12_4_ =
               fStack_aa0 * auVar69._12_4_ +
               local_ac8._4_4_ * auVar84._12_4_ + local_ab8._4_4_ * auVar27._12_4_;
          local_868._0_4_ = auVar40._0_4_ + local_8d8._0_4_ + local_878._0_4_;
          local_868._4_4_ = auVar40._4_4_ + local_8d8._4_4_ + local_878._4_4_;
          local_868._8_4_ = auVar40._8_4_ + local_8d8._8_4_ + local_878._8_4_;
          local_868._12_4_ = auVar40._12_4_ + local_8d8._12_4_ + local_878._12_4_;
          auVar69 = vminps_avx(local_8d8,local_878);
          auVar69 = vminps_avx(auVar69,auVar40);
          auVar63._8_4_ = 0x7fffffff;
          auVar63._0_8_ = 0x7fffffff7fffffff;
          auVar63._12_4_ = 0x7fffffff;
          local_8e8 = vandps_avx(local_868,auVar63);
          auVar64._0_4_ = local_8e8._0_4_ * 1.1920929e-07;
          auVar64._4_4_ = local_8e8._4_4_ * 1.1920929e-07;
          auVar64._8_4_ = local_8e8._8_4_ * 1.1920929e-07;
          auVar64._12_4_ = local_8e8._12_4_ * 1.1920929e-07;
          uVar17 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
          auVar88._0_8_ = uVar17 ^ 0x8000000080000000;
          auVar88._8_4_ = -auVar64._8_4_;
          auVar88._12_4_ = -auVar64._12_4_;
          auVar69 = vcmpps_avx(auVar69,auVar88,5);
          auVar84 = vmaxps_avx(local_8d8,local_878);
          auVar84 = vmaxps_avx(auVar84,auVar40);
          auVar84 = vcmpps_avx(auVar84,auVar64,2);
          local_8f8 = vorps_avx(auVar69,auVar84);
          local_acd = 0;
          auVar69 = local_9b8 & local_8f8;
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') {
            auVar41._0_4_ = fVar129 * fVar49;
            auVar41._4_4_ = fVar132 * fVar57;
            auVar41._8_4_ = fVar133 * fVar33;
            auVar41._12_4_ = fVar134 * fVar34;
            auVar53._0_4_ = fVar145 * fVar119;
            auVar53._4_4_ = fVar146 * fVar121;
            auVar53._8_4_ = fVar147 * fVar122;
            auVar53._12_4_ = fVar148 * fVar123;
            auVar27 = vsubps_avx(auVar53,auVar41);
            auVar65._0_4_ = fVar119 * fVar124;
            auVar65._4_4_ = fVar121 * fVar126;
            auVar65._8_4_ = fVar122 * fVar127;
            auVar65._12_4_ = fVar123 * fVar128;
            auVar89._0_4_ = fVar129 * fVar73;
            auVar89._4_4_ = fVar132 * fVar79;
            auVar89._8_4_ = fVar133 * fVar81;
            auVar89._12_4_ = fVar134 * fVar83;
            auVar60 = vsubps_avx(auVar89,auVar65);
            auVar69 = vandps_avx(auVar63,auVar41);
            auVar84 = vandps_avx(auVar63,auVar65);
            auVar69 = vcmpps_avx(auVar69,auVar84,1);
            local_808 = vblendvps_avx(auVar60,auVar27,auVar69);
            auVar42._0_4_ = fVar136 * fVar73;
            auVar42._4_4_ = fVar140 * fVar79;
            auVar42._8_4_ = fVar142 * fVar81;
            auVar42._12_4_ = fVar144 * fVar83;
            auVar54._0_4_ = fVar136 * fVar49;
            auVar54._4_4_ = fVar140 * fVar57;
            auVar54._8_4_ = fVar142 * fVar33;
            auVar54._12_4_ = fVar144 * fVar34;
            auVar66._0_4_ = fVar119 * fVar135;
            auVar66._4_4_ = fVar121 * fVar139;
            auVar66._8_4_ = fVar122 * fVar141;
            auVar66._12_4_ = fVar123 * fVar143;
            auVar27 = vsubps_avx(auVar54,auVar66);
            auVar91._0_4_ = fVar119 * fVar35;
            auVar91._4_4_ = fVar121 * fVar46;
            auVar91._8_4_ = fVar122 * fVar47;
            auVar91._12_4_ = fVar123 * fVar48;
            auVar60 = vsubps_avx(auVar91,auVar42);
            auVar69 = vandps_avx(auVar63,auVar66);
            auVar84 = vandps_avx(auVar63,auVar42);
            auVar69 = vcmpps_avx(auVar69,auVar84,1);
            local_7f8 = vblendvps_avx(auVar60,auVar27,auVar69);
            auVar30._0_4_ = fVar129 * fVar35;
            auVar30._4_4_ = fVar132 * fVar46;
            auVar30._8_4_ = fVar133 * fVar47;
            auVar30._12_4_ = fVar134 * fVar48;
            auVar55._0_4_ = fVar129 * fVar135;
            auVar55._4_4_ = fVar132 * fVar139;
            auVar55._8_4_ = fVar133 * fVar141;
            auVar55._12_4_ = fVar134 * fVar143;
            auVar67._0_4_ = fVar145 * fVar136;
            auVar67._4_4_ = fVar146 * fVar140;
            auVar67._8_4_ = fVar147 * fVar142;
            auVar67._12_4_ = fVar148 * fVar144;
            auVar92._0_4_ = fVar136 * fVar124;
            auVar92._4_4_ = fVar140 * fVar126;
            auVar92._8_4_ = fVar142 * fVar127;
            auVar92._12_4_ = fVar144 * fVar128;
            auVar27 = vsubps_avx(auVar55,auVar67);
            auVar60 = vsubps_avx(auVar92,auVar30);
            auVar69 = vandps_avx(auVar63,auVar67);
            auVar84 = vandps_avx(auVar63,auVar30);
            auVar69 = vcmpps_avx(auVar69,auVar84,1);
            local_7e8 = vblendvps_avx(auVar60,auVar27,auVar69);
            fVar49 = local_808._0_4_ * fStack_aa0 +
                     local_7f8._0_4_ * local_ac8._4_4_ + local_7e8._0_4_ * local_ab8._4_4_;
            fVar35 = local_808._4_4_ * fStack_aa0 +
                     local_7f8._4_4_ * local_ac8._4_4_ + local_7e8._4_4_ * local_ab8._4_4_;
            fVar57 = local_808._8_4_ * fStack_aa0 +
                     local_7f8._8_4_ * local_ac8._4_4_ + local_7e8._8_4_ * local_ab8._4_4_;
            fVar46 = local_808._12_4_ * fStack_aa0 +
                     local_7f8._12_4_ * local_ac8._4_4_ + local_7e8._12_4_ * local_ab8._4_4_;
            auVar68._0_4_ = fVar49 + fVar49;
            auVar68._4_4_ = fVar35 + fVar35;
            auVar68._8_4_ = fVar57 + fVar57;
            auVar68._12_4_ = fVar46 + fVar46;
            fVar49 = local_808._0_4_ * fVar11 + local_7f8._0_4_ * fVar2 + local_7e8._0_4_ * fVar114;
            fVar35 = local_808._4_4_ * fVar13 + local_7f8._4_4_ * fVar12 + local_7e8._4_4_ * fVar116
            ;
            fVar58 = local_808._8_4_ * fVar59 + local_7f8._8_4_ * fVar58 + local_7e8._8_4_ * fVar117
            ;
            fVar59 = local_808._12_4_ * fVar15 +
                     local_7f8._12_4_ * fVar14 + local_7e8._12_4_ * fVar118;
            auVar69 = vrcpps_avx(auVar68);
            fVar2 = auVar69._0_4_;
            auVar98._0_4_ = auVar68._0_4_ * fVar2;
            fVar11 = auVar69._4_4_;
            auVar98._4_4_ = auVar68._4_4_ * fVar11;
            fVar12 = auVar69._8_4_;
            auVar98._8_4_ = auVar68._8_4_ * fVar12;
            fVar13 = auVar69._12_4_;
            auVar98._12_4_ = auVar68._12_4_ * fVar13;
            auVar105._8_4_ = 0x3f800000;
            auVar105._0_8_ = 0x3f8000003f800000;
            auVar105._12_4_ = 0x3f800000;
            auVar69 = vsubps_avx(auVar105,auVar98);
            local_818._0_4_ = (fVar49 + fVar49) * (fVar2 + fVar2 * auVar69._0_4_);
            local_818._4_4_ = (fVar35 + fVar35) * (fVar11 + fVar11 * auVar69._4_4_);
            local_818._8_4_ = (fVar58 + fVar58) * (fVar12 + fVar12 * auVar69._8_4_);
            local_818._12_4_ = (fVar59 + fVar59) * (fVar13 + fVar13 * auVar69._12_4_);
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar93._4_4_ = uVar3;
            auVar93._0_4_ = uVar3;
            auVar93._8_4_ = uVar3;
            auVar93._12_4_ = uVar3;
            auVar69 = vcmpps_avx(auVar93,local_818,2);
            fVar2 = ray->tfar;
            auVar99._4_4_ = fVar2;
            auVar99._0_4_ = fVar2;
            auVar99._8_4_ = fVar2;
            auVar99._12_4_ = fVar2;
            auVar84 = vcmpps_avx(local_818,auVar99,2);
            auVar69 = vandps_avx(auVar69,auVar84);
            auVar84 = vcmpps_avx(auVar68,_DAT_01f45a50,4);
            auVar69 = vandps_avx(auVar84,auVar69);
            auVar84 = vpand_avx(local_8f8,local_9b8);
            auVar69 = vpslld_avx(auVar69,0x1f);
            auVar69 = vpsrad_avx(auVar69,0x1f);
            local_848 = vpand_avx(auVar69,auVar84);
            uVar16 = vmovmskps_avx(local_848);
            if (uVar16 != 0) {
              local_888 = local_8d8;
              local_858 = &local_acd;
              auVar69 = vrcpps_avx(local_868);
              fVar2 = auVar69._0_4_;
              auVar43._0_4_ = local_868._0_4_ * fVar2;
              fVar11 = auVar69._4_4_;
              auVar43._4_4_ = local_868._4_4_ * fVar11;
              fVar12 = auVar69._8_4_;
              auVar43._8_4_ = local_868._8_4_ * fVar12;
              fVar13 = auVar69._12_4_;
              auVar43._12_4_ = local_868._12_4_ * fVar13;
              auVar56._8_4_ = 0x3f800000;
              auVar56._0_8_ = 0x3f8000003f800000;
              auVar56._12_4_ = 0x3f800000;
              auVar69 = vsubps_avx(auVar56,auVar43);
              auVar31._0_4_ = fVar2 + fVar2 * auVar69._0_4_;
              auVar31._4_4_ = fVar11 + fVar11 * auVar69._4_4_;
              auVar31._8_4_ = fVar12 + fVar12 * auVar69._8_4_;
              auVar31._12_4_ = fVar13 + fVar13 * auVar69._12_4_;
              auVar44._8_4_ = 0x219392ef;
              auVar44._0_8_ = 0x219392ef219392ef;
              auVar44._12_4_ = 0x219392ef;
              auVar69 = vcmpps_avx(local_8e8,auVar44,5);
              auVar69 = vandps_avx(auVar69,auVar31);
              auVar45._0_4_ = local_8d8._0_4_ * auVar69._0_4_;
              auVar45._4_4_ = local_8d8._4_4_ * auVar69._4_4_;
              auVar45._8_4_ = local_8d8._8_4_ * auVar69._8_4_;
              auVar45._12_4_ = local_8d8._12_4_ * auVar69._12_4_;
              local_838 = vminps_avx(auVar45,auVar56);
              auVar32._0_4_ = local_878._0_4_ * auVar69._0_4_;
              auVar32._4_4_ = local_878._4_4_ * auVar69._4_4_;
              auVar32._8_4_ = local_878._8_4_ * auVar69._8_4_;
              auVar32._12_4_ = local_878._12_4_ * auVar69._12_4_;
              local_828 = vminps_avx(auVar32,auVar56);
              uVar17 = (ulong)(uVar16 & 0xff);
              local_a30 = puVar22;
              do {
                uVar19 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                local_a00 = *(uint *)((long)&local_898 + uVar19 * 4);
                pGVar10 = (pSVar20->geometries).items[local_a00].ptr;
                if ((pGVar10->mask & ray->mask) == 0) {
                  uVar17 = uVar17 ^ 1L << (uVar19 & 0x3f);
                }
                else {
                  local_aa8 = local_a90->args;
                  if ((local_a90->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b69f10;
                  local_a58._0_8_ = uVar17;
                  local_a48._0_8_ = pSVar20;
                  local_ab8 = uVar23;
                  local_9e8.context = local_a90->user;
                  local_a18 = *(undefined4 *)(local_808 + uVar19 * 4);
                  local_a14 = *(undefined4 *)(local_7f8 + uVar19 * 4);
                  local_a10 = *(undefined4 *)(local_7e8 + uVar19 * 4);
                  local_a0c = *(undefined4 *)(local_838 + uVar19 * 4);
                  local_a08 = *(undefined4 *)(local_828 + uVar19 * 4);
                  local_a04 = *(undefined4 *)((long)&local_8a8 + uVar19 * 4);
                  local_9fc = (local_9e8.context)->instID[0];
                  local_9f8 = (local_9e8.context)->instPrimID[0];
                  local_a78._0_4_ = ray->tfar;
                  local_a68._0_8_ = uVar19;
                  ray->tfar = *(float *)(local_818 + uVar19 * 4);
                  local_acc = -1;
                  local_9e8.valid = &local_acc;
                  local_9e8.geometryUserPtr = pGVar10->userPtr;
                  local_ac8 = ray;
                  local_9e8.hit = (RTCHitN *)&local_a18;
                  local_9e8.N = 1;
                  local_a88._0_8_ = pGVar10;
                  local_9e8.ray = (RTCRayN *)ray;
                  if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar10->occlusionFilterN)(&local_9e8), *local_9e8.valid != 0)) {
                    ray = local_ac8;
                    if ((local_aa8->filter == (RTCFilterFunctionN)0x0) ||
                       (((local_aa8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        ((*(byte *)(local_a88._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00b69f10:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (*local_aa8->filter)(&local_9e8);
                    ray = local_ac8;
                    if (*local_9e8.valid != 0) goto LAB_00b69f10;
                  }
                  local_ac8->tfar = (float)local_a78._0_4_;
                  uVar17 = local_a58._0_8_ ^ 1L << (local_a68._0_8_ & 0x3f);
                  pSVar20 = (Scene *)local_a48._0_8_;
                  ray = local_ac8;
                  puVar22 = local_a30;
                  uVar23 = local_ab8;
                }
              } while (uVar17 != 0);
            }
          }
          auVar100 = ZEXT1664(local_908);
          auVar106 = ZEXT1664(local_918);
          auVar113 = ZEXT1664(local_928);
          auVar115 = ZEXT1664(local_938);
          auVar120 = ZEXT1664(local_948);
          auVar77 = ZEXT1664(local_958);
          auVar125 = ZEXT1664(local_968);
          auVar90 = ZEXT1664(local_978);
          auVar70 = ZEXT1664(local_988);
          auVar94 = ZEXT1664(local_998);
          auVar131 = ZEXT1664(local_9a8);
          context = local_a90;
        }
        goto LAB_00b695e4;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }